

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::StartQueueTrackedObject(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->queueTrackedObject == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8e6,"(!this->queueTrackedObject)","!this->queueTrackedObject");
    if (!bVar2) goto LAB_0067f2fe;
    *puVar3 = 0;
  }
  bVar2 = HasPendingTrackObjects(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8e7,"(!this->HasPendingTrackObjects())","!this->HasPendingTrackObjects()")
    ;
    if (!bVar2) goto LAB_0067f2fe;
    *puVar3 = 0;
  }
  if ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next !=
      &this->clientTrackedObjectList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8e9,"(this->clientTrackedObjectList.Empty())",
                       "this->clientTrackedObjectList.Empty()");
    if (!bVar2) goto LAB_0067f2fe;
    *puVar3 = 0;
  }
  if (this->inPartialCollectMode == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8ea,"(!this->inPartialCollectMode)","!this->inPartialCollectMode");
    if (!bVar2) {
LAB_0067f2fe:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->queueTrackedObject = true;
  return;
}

Assistant:

void
Recycler::StartQueueTrackedObject()
{
    Assert(!this->queueTrackedObject);
    Assert(!this->HasPendingTrackObjects());
#if ENABLE_PARTIAL_GC
    Assert(this->clientTrackedObjectList.Empty());
    Assert(!this->inPartialCollectMode);
#endif
    this->queueTrackedObject = true;
}